

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Signal_PDU::Encode(Signal_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  reference pcVar3;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  Signal_PDU *this_local;
  
  Radio_Communications_Header::Encode(&this->super_Radio_Communications_Header,stream);
  pKVar2 = DATA_TYPE::operator<<(stream,&(this->m_EncodingScheme).super_DataTypeBase);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui32SampleRate);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16DataLength);
  KDataStream::operator<<(pKVar2,this->m_ui16Samples);
  citrEnd = std::vector<char,_std::allocator<char>_>::begin(&this->m_vData);
  local_28._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(&this->m_vData);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    pcVar3 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&citrEnd);
    KDataStream::operator<<(stream,*pcVar3);
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(&citrEnd);
  }
  return;
}

Assistant:

void Signal_PDU::Encode( KDataStream & stream ) const
{
    Radio_Communications_Header::Encode( stream );

    stream << KDIS_STREAM m_EncodingScheme
           << m_ui32SampleRate
           << m_ui16DataLength
           << m_ui16Samples;

    vector<KOCTET>::const_iterator citr = m_vData.begin();
    vector<KOCTET>::const_iterator citrEnd = m_vData.end();
    for( ; citr != citrEnd; ++citr )
    {
        stream << *citr;
    }
}